

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha1_3reg_arm(void *vd,void *vn,void *vm,uint32_t op)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t local_78;
  int local_74;
  uint32_t t;
  int i;
  CRYPTO_STATE m;
  CRYPTO_STATE n;
  CRYPTO_STATE d;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  void *pvStack_20;
  uint32_t op_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  n.l[1] = *vd;
  d.l[0] = *(ulong *)((long)vd + 8);
  m.l[1] = *vn;
  n.l[0] = *(uint64_t *)((long)vn + 8);
  _t = *vm;
  m.l[0] = *(ulong *)((long)vm + 8);
  rn = (uint64_t *)vd;
  if (op == 3) {
    n.l[1] = d.l[0] ^ _t ^ n.l[1];
    d.l[0] = m.l[1] ^ m.l[0] ^ d.l[0];
  }
  else {
    d.l[1] = (uint64_t)vm;
    rm = (uint64_t *)vn;
    rd._4_4_ = op;
    pvStack_20 = vm;
    vm_local = vn;
    vn_local = vd;
    for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
      if (rd._4_4_ == 0) {
        local_78 = cho(n.words[3],d.words[0],d.words[1]);
      }
      else if (rd._4_4_ == 1) {
        local_78 = par(n.words[3],d.words[0],d.words[1]);
      }
      else {
        if (rd._4_4_ != 2) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                     ,0x104,(char *)0x0);
        }
        local_78 = maj(n.words[3],d.words[0],d.words[1]);
      }
      uVar1 = rol32(n.words[2],5);
      iVar2 = uVar1 + m.words[2];
      uVar1 = (&t)[local_74];
      m.words[2] = d.words[1];
      d.words[1] = d.words[0];
      uVar3 = ror32(n.words[3],2);
      d.words[0] = uVar3;
      n.l[1] = CONCAT44((int)n.l[1],iVar2 + uVar1 + local_78);
    }
  }
  *rn = n.l[1];
  rn[1] = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sha1_3reg)(void *vd, void *vn, void *vm, uint32_t op)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    if (op == 3) { /* sha1su0 */
        d.l[0] ^= d.l[1] ^ m.l[0];
        d.l[1] ^= n.l[0] ^ m.l[1];
    } else {
        int i;

        for (i = 0; i < 4; i++) {
            uint32_t t = 0;

            switch (op) {
            case 0: /* sha1c */
                t = cho(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 1: /* sha1p */
                t = par(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 2: /* sha1m */
                t = maj(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            default:
                g_assert_not_reached();
            }
            t += rol32(CR_ST_WORD(d, 0), 5) + CR_ST_WORD(n, 0)
                 + CR_ST_WORD(m, i);

            CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3);
            CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
            CR_ST_WORD(d, 2) = ror32(CR_ST_WORD(d, 1), 2);
            CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
            CR_ST_WORD(d, 0) = t;
        }
    }
    rd[0] = d.l[0];
    rd[1] = d.l[1];
}